

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_sse4.c
# Opt level: O2

void cdef_copy_rect8_8bit_to_16bit_sse4_1
               (uint16_t *dst,int dstride,uint8_t *src,int sstride,int width,int height)

{
  ushort *puVar1;
  ulong uVar2;
  ulong uVar3;
  byte *pbVar4;
  long lVar5;
  undefined1 in_XMM0 [16];
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)height;
  if (height < 1) {
    uVar2 = uVar3;
  }
  for (; uVar3 != uVar2; uVar3 = uVar3 + 1) {
    puVar1 = dst;
    pbVar4 = src;
    for (lVar5 = 0; lVar5 < (int)(width & 0xfffffff8); lVar5 = lVar5 + 8) {
      in_XMM0 = pmovzxbw(in_XMM0,*(undefined8 *)(src + lVar5));
      *(undefined1 (*) [16])(dst + lVar5) = in_XMM0;
      puVar1 = puVar1 + 8;
      pbVar4 = pbVar4 + 8;
    }
    for (; lVar5 < width; lVar5 = lVar5 + 1) {
      *puVar1 = (ushort)*pbVar4;
      puVar1 = puVar1 + 1;
      pbVar4 = pbVar4 + 1;
    }
    dst = dst + dstride;
    src = src + sstride;
  }
  return;
}

Assistant:

void cdef_copy_rect8_8bit_to_16bit_sse4_1(uint16_t *dst, int dstride,
                                          const uint8_t *src, int sstride,
                                          int width, int height) {
  int j = 0;
  for (int i = 0; i < height; i++) {
    for (j = 0; j < (width & ~0x7); j += 8) {
      v64 row = v64_load_unaligned(&src[i * sstride + j]);
      v128_store_unaligned(&dst[i * dstride + j], v128_unpack_u8_s16(row));
    }
    for (; j < width; j++) {
      dst[i * dstride + j] = src[i * sstride + j];
    }
  }
}